

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::checkForDeadlock
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ZEeventsChecker *pZVar1;
  bool bVar2;
  mapped_type mVar3;
  int x;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *this_00;
  ostream *poVar6;
  ze_event_handle_t *__k;
  char *pcVar7;
  uint32_t i;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint32_t this_action_new_node_id;
  ze_event_handle_t hSignalEvent_local;
  ZEeventsChecker *local_2c8;
  GraphCycles *local_2c0;
  _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_2b8;
  ulong local_2b0;
  vector<int,_std::allocator<int>_> dagIDsInPath;
  anon_class_8_1_8991fb9c getActionDetails;
  string fromAction;
  pair<std::vector<int,_std::allocator<int>_>,_bool> path;
  string toAction;
  string action;
  string spacePrefix;
  string local_1c8;
  ostringstream oss;
  
  this_action_new_node_id = 0xffffffff;
  hSignalEvent_local = hSignalEvent;
  if (hSignalEvent != (ze_event_handle_t)0x0) {
    iVar4 = std::
            _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->eventToDagID)._M_h,&hSignalEvent_local);
    if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      pcVar7 = "Warning: hSignalEvent {";
      goto LAB_00180831;
    }
    validateSignalEventOwnership(this,zeCallDisc,hSignalEvent_local);
    if (*(uint32_t *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                ._M_cur + 0x10) != 0xffffffff) {
      this_action_new_node_id =
           *(uint32_t *)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                   ._M_cur + 0x10);
    }
  }
  local_2b8 = &(this->eventToDagID)._M_h;
  local_2b0 = (ulong)numWaitEvents;
  lVar10 = local_2b0 + 1;
  __k = phWaitEvents;
  local_2c8 = this;
  while (lVar10 = lVar10 + -1, lVar10 != 0) {
    iVar4 = std::
            _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_2b8,__k);
    __k = __k + 1;
    if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) goto code_r0x00180423;
  }
  if (this_action_new_node_id == 0xffffffff) {
    mVar3 = xla::GraphCycles::NewNode(&local_2c8->dag);
    this_action_new_node_id = mVar3;
    pmVar5 = std::__detail::
             _Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_2b8,&hSignalEvent_local);
    *pmVar5 = mVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar6 = std::operator<<((ostream *)&oss,(string *)zeCallDisc);
  poVar6 = std::operator<<(poVar6,": (hSignalEvent{");
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::operator<<(poVar6,"}, phWaitEvents{");
  for (uVar8 = 0; local_2b0 != uVar8; uVar8 = uVar8 + 1) {
    std::ostream::_M_insert<void_const*>((ostream *)&oss);
    if (uVar8 < numWaitEvents - 1) {
      std::operator<<((ostream *)&oss,", ");
    }
  }
  std::operator<<((ostream *)&oss,"})");
  std::__cxx11::stringbuf::str();
  pZVar1 = local_2c8;
  std::__cxx11::string::string((string *)&fromAction,(string *)&action);
  this_00 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pZVar1->dagIDToAction,&this_action_new_node_id);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
  ::operator=(this_00,(type)&fromAction);
  std::__cxx11::string::~string((string *)&fromAction);
  local_2c0 = &pZVar1->dag;
  uVar8 = 0;
  do {
    if (uVar8 == local_2b0) {
LAB_001808aa:
      std::__cxx11::string::~string((string *)&action);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      return;
    }
    iVar4 = std::
            _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_2b8,phWaitEvents + uVar8);
    if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Warning: phWaitEvents {");
      poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
      poVar6 = std::operator<<(poVar6,"} might be an invalid event in call to ");
      poVar6 = std::operator<<(poVar6,(string *)zeCallDisc);
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_001808aa;
    }
    x = *(int *)((long)iVar4.
                       super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                       ._M_cur + 0x10);
    if (x == -1) {
      x = xla::GraphCycles::NewNode(local_2c0);
      *(int *)((long)iVar4.
                     super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                     ._M_cur + 0x10) = x;
    }
    getActionDetails.this = local_2c8;
    bVar2 = xla::GraphCycles::InsertEdge(local_2c0,x,this_action_new_node_id);
    if (!bVar2) {
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_(&fromAction,&getActionDetails,x);
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_(&toAction,&getActionDetails,this_action_new_node_id);
      std::operator<<((ostream *)&std::cerr,"Warning: There may be a potential event deadlock!\n");
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "Adding the following dependency would create a cycle in the DAG:\n\tFrom: "
                              );
      poVar6 = std::operator<<(poVar6,(string *)&fromAction);
      poVar6 = std::operator<<(poVar6,"\n\tTo: ");
      poVar6 = std::operator<<(poVar6,(string *)&toAction);
      std::operator<<(poVar6,"\n");
      std::operator<<((ostream *)&std::cerr,"There is already a path:\n");
      xla::GraphCycles::PathDagIDs(&path,local_2c0,this_action_new_node_id,x,0xf);
      std::vector<int,_std::allocator<int>_>::vector(&dagIDsInPath,&path.first);
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_
                (&spacePrefix,&getActionDetails,
                 *dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&spacePrefix);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&spacePrefix);
      std::__cxx11::string::string((string *)&spacePrefix,"",(allocator *)&local_1c8);
      for (uVar9 = 1;
          uVar9 < (ulong)((long)dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2);
          uVar9 = (ulong)((int)uVar9 + 1)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&spacePrefix);
        poVar6 = std::operator<<(poVar6,"|\n");
        poVar6 = std::operator<<(poVar6,(string *)&spacePrefix);
        poVar6 = std::operator<<(poVar6,"-> ");
        checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
        ::$_0::operator()[abi_cxx11_
                  (&local_1c8,&getActionDetails,
                   dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        poVar6 = std::operator<<(poVar6,(string *)&local_1c8);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::append((char *)&spacePrefix);
      }
      if (path.second != false) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&spacePrefix);
        poVar6 = std::operator<<(poVar6,"|\n");
        poVar6 = std::operator<<(poVar6,(string *)&spacePrefix);
        std::operator<<(poVar6,"-> ...\n");
      }
      std::__cxx11::string::~string((string *)&spacePrefix);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&path);
      std::__cxx11::string::~string((string *)&toAction);
      std::__cxx11::string::~string((string *)&fromAction);
    }
    uVar8 = uVar8 + 1;
  } while( true );
code_r0x00180423:
  pcVar7 = "Warning: phWaitEvents {";
LAB_00180831:
  poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  poVar6 = std::operator<<(poVar6,"} might be an invalid event in call to ");
  poVar6 = std::operator<<(poVar6,(string *)zeCallDisc);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::checkForDeadlock(
    const std::string &zeCallDisc,        /// action discription
    const ze_event_handle_t hSignalEvent, ///< [in][optional] handle of the event to forming the outgoing edge in the DAG
    const uint32_t numWaitEvents,         ///< [in][optional] number of events that point to this action.
    const ze_event_handle_t *phWaitEvents ///< [in][optional][range(0, numWaitEvents)] handle of the events that point to this action.
) {

    uint32_t this_action_new_node_id = invalidDagID;

    if (hSignalEvent != nullptr) {

        auto it = eventToDagID.find(hSignalEvent);
        // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: hSignalEvent {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }

        // A passive check to see if the user is using the same event for multiple actions.
        // It only print warnings and does not stop the event deadlock checker.
        validateSignalEventOwnership(zeCallDisc, hSignalEvent);

        if (it->second != invalidDagID) {
            // This event already exists in the DAG. Get the DAG node ID.
            // For example when there is indeed a deadlock it would have already been created.
            this_action_new_node_id = it->second;
        }
    }

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        if (eventToDagID.find(phWaitEvents[i]) == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
    }

    if (this_action_new_node_id == invalidDagID) {
        // Create node in DAG
        this_action_new_node_id = addNodeInDag();

        // Now we know where the hSignalEvent points from/out in the DAG. Update the eventToDagID map.
        eventToDagID[hSignalEvent] = this_action_new_node_id;
    }

    // Add this action to the actionToDagID map.
    std::ostringstream oss;
    oss << zeCallDisc << ": (hSignalEvent{" << hSignalEvent << "}, phWaitEvents{";

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        oss << phWaitEvents[i];
        if (i < numWaitEvents - 1) {
            oss << ", ";
        }
    }
    oss << "})";

    std::string action = oss.str(); // Convert the stream to a string.
    dagIDToAction[this_action_new_node_id] = actionAndSignalEvent(action, hSignalEvent);

    // Form the dependency in the DAG
    for (uint32_t i = 0; i < numWaitEvents; i++) {
        auto it = eventToDagID.find(phWaitEvents[i]);
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << phWaitEvents[i] << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
        uint32_t dagID = it->second;
        if (dagID == invalidDagID) {
            // Create a new node in the DAG for this wait event. That action will be created some time in the future.
            dagID = addNodeInDag();
            it->second = dagID;
        }

        auto getActionDetails = [&](int dagID) -> std::string {
            auto actionIt = dagIDToAction.find(dagID);
            return (actionIt != dagIDToAction.end()) ? actionIt->second.first : "PLACEHOLDER";
        };

        if (!addEdgeInDag(dagID, this_action_new_node_id)) {
            std::string fromAction = getActionDetails(dagID);
            std::string toAction = getActionDetails(this_action_new_node_id);

            std::cerr << "Warning: There may be a potential event deadlock!\n";
            std::cerr << "Adding the following dependency would create a cycle in the DAG:\n\tFrom: " << fromAction << "\n\tTo: " << toAction << "\n";
            std::cerr << "There is already a path:\n";

            constexpr uint32_t maxPathLength = 15;
            auto path = dag.PathDagIDs(this_action_new_node_id, dagID, maxPathLength);
            auto dagIDsInPath = path.first;
            std::cerr << getActionDetails(dagIDsInPath[0]) << "\n";
            std::string spacePrefix = "";
            for (uint32_t j = 1; j < dagIDsInPath.size(); j++) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> " << getActionDetails(dagIDsInPath[j]) << "\n";
                spacePrefix += "   ";
            }
            if (path.second) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> ...\n";
            }
        }
    }
}